

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtAudio.cpp
# Opt level: O3

DeviceInfo * __thiscall
RtApi::getDeviceInfo(DeviceInfo *__return_storage_ptr__,RtApi *this,uint deviceId)

{
  pointer pcVar1;
  RtAudioFormat RVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pDVar7;
  ulong uVar8;
  ulong uVar9;
  pointer pDVar10;
  
  pDVar10 = (this->deviceList_).
            super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
            super__Vector_impl_data._M_start;
  pDVar7 = (this->deviceList_).
           super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pDVar7 == pDVar10) {
    (*this->_vptr_RtApi[0xb])(this);
    pDVar10 = (this->deviceList_).
              super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
              super__Vector_impl_data._M_start;
    pDVar7 = (this->deviceList_).
             super__Vector_base<RtAudio::DeviceInfo,_std::allocator<RtAudio::DeviceInfo>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  if ((long)pDVar7 - (long)pDVar10 != 0) {
    uVar6 = ((long)pDVar7 - (long)pDVar10 >> 5) * -0x5555555555555555;
    uVar5 = 1;
    uVar9 = 0;
    do {
      uVar8 = uVar5;
      if (pDVar10[uVar9].ID == deviceId) {
        __return_storage_ptr__->ID = deviceId;
        (__return_storage_ptr__->name)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->name).field_2;
        pcVar1 = pDVar10[uVar9].name._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->name,pcVar1,
                   pcVar1 + pDVar10[uVar9].name._M_string_length);
        uVar3 = pDVar10[uVar9].outputChannels;
        uVar4 = pDVar10[uVar9].inputChannels;
        *(undefined8 *)((long)&__return_storage_ptr__->inputChannels + 2) =
             *(undefined8 *)((long)&pDVar10[uVar9].inputChannels + 2);
        __return_storage_ptr__->outputChannels = uVar3;
        __return_storage_ptr__->inputChannels = uVar4;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  (&__return_storage_ptr__->sampleRates,&pDVar10[uVar9].sampleRates);
        uVar3 = pDVar10[uVar9].preferredSampleRate;
        RVar2 = pDVar10[uVar9].nativeFormats;
        __return_storage_ptr__->currentSampleRate = pDVar10[uVar9].currentSampleRate;
        __return_storage_ptr__->preferredSampleRate = uVar3;
        __return_storage_ptr__->nativeFormats = RVar2;
        return __return_storage_ptr__;
      }
      uVar5 = (ulong)((int)uVar8 + 1);
      uVar9 = uVar8;
    } while (uVar8 <= uVar6 && uVar6 - uVar8 != 0);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->errorText_,0,(char *)(this->errorText_)._M_string_length,0x115564);
  error(this,RTAUDIO_INVALID_PARAMETER);
  *(undefined8 *)__return_storage_ptr__ = 0;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)0x0;
  (__return_storage_ptr__->name)._M_string_length = 0;
  (__return_storage_ptr__->name).field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->name).field_2 + 8) = 0;
  __return_storage_ptr__->outputChannels = 0;
  __return_storage_ptr__->inputChannels = 0;
  __return_storage_ptr__->duplexChannels = 0;
  __return_storage_ptr__->isDefaultOutput = false;
  __return_storage_ptr__->isDefaultInput = false;
  *(undefined2 *)&__return_storage_ptr__->field_0x36 = 0;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->name).field_2
  ;
  (__return_storage_ptr__->name).field_2._M_local_buf[0] = '\0';
  __return_storage_ptr__->outputChannels = 0;
  __return_storage_ptr__->inputChannels = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->inputChannels + 2) = 0;
  (__return_storage_ptr__->sampleRates).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (__return_storage_ptr__->sampleRates).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->sampleRates).
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->currentSampleRate = 0;
  __return_storage_ptr__->preferredSampleRate = 0;
  __return_storage_ptr__->nativeFormats = 0;
  return __return_storage_ptr__;
}

Assistant:

RtAudio::DeviceInfo RtApi :: getDeviceInfo( unsigned int deviceId )
{
  if ( deviceList_.size() == 0 ) probeDevices();
  for ( unsigned int m=0; m<deviceList_.size(); m++ ) {
    if ( deviceList_[m].ID == deviceId )
      return deviceList_[m];
  }

  errorText_ = "RtApi::getDeviceInfo: deviceId argument not found.";
  error( RTAUDIO_INVALID_PARAMETER );
  return RtAudio::DeviceInfo();
}